

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O1

dlist_t * dlist_getl(dlist_head_t *head,dlist_t *dlist)

{
  dlist_t *pdVar1;
  dlist_s *pdVar2;
  bool bVar3;
  dlist_t *pdVar4;
  
  pdVar1 = head->dlist;
  bVar3 = false;
  if (pdVar1 == (dlist_t *)0x0 || dlist == (dlist_t *)0x0) {
    return (dlist_t *)0x0;
  }
  if (pdVar1 == dlist) {
    pdVar2 = dlist->next;
    head->dlist = pdVar2;
    bVar3 = true;
    if (pdVar2 != (dlist_s *)0x0) {
      pdVar2->prev = (dlist_s *)0x0;
    }
  }
  if (head->end == dlist) {
    pdVar2 = dlist->prev;
    head->end = pdVar2;
    bVar3 = true;
    if (pdVar2 != (dlist_s *)0x0) {
      pdVar2->next = (dlist_s *)0x0;
    }
  }
  if (!bVar3) {
    do {
      pdVar4 = pdVar1;
      pdVar1 = pdVar4->next;
      if (pdVar1 == (dlist_s *)0x0) break;
    } while (pdVar1 != dlist);
    if (pdVar1 == (dlist_s *)0x0) {
      return (dlist_t *)0x0;
    }
    pdVar2 = dlist->next;
    pdVar4->next = pdVar2;
    if (pdVar2 != (dlist_s *)0x0) {
      pdVar2->prev = pdVar4;
    }
  }
  head->num = head->num - 1;
  dlist->next = (dlist_s *)0x0;
  dlist->prev = (dlist_s *)0x0;
  return dlist;
}

Assistant:

dlist_t *dlist_getl(dlist_head_t *head, dlist_t *dlist) {
   dlist_t *tmp = head->dlist;
   int     found = 0;

   if (!head || !dlist || !tmp)
      return NULL;

   if (head->dlist == dlist) {
      head->dlist = dlist->next;
      if (head->dlist)
         head->dlist->prev = NULL;

      found = 1;
   }

   if (head->end == dlist) {
      head->end = dlist->prev;
      if (head->end)
         head->end->next = NULL;

      found = 1;
   }

   if (!found) {
      while (tmp->next && (tmp->next != dlist)) {
         tmp = tmp->next;
      }
      
      if (!tmp->next) {
         return NULL;
      } else {
         if ((tmp->next = dlist->next)) {
            tmp->next->prev = tmp;
         }
      }
   }

   head->num--;
   dlist->prev = dlist->next = NULL;
   return dlist;
}